

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sinproc.c
# Opt level: O1

int nn_sinproc_recv(nn_pipebase *self,nn_msg *msg)

{
  int iVar1;
  void **ppvVar2;
  nn_msgqueue *unaff_R14;
  
  ppvVar2 = &self[-1].data;
  if (self == (nn_pipebase *)0x0) {
    ppvVar2 = (void **)0x0;
  }
  if (((nn_ep_options *)(ppvVar2 + 0xb))->sndprio - 6U < 0xfffffffe) {
    nn_sinproc_recv_cold_3();
LAB_00134c06:
    nn_sinproc_recv_cold_1();
  }
  else {
    unaff_R14 = (nn_msgqueue *)(ppvVar2 + 0x28);
    iVar1 = nn_msgqueue_recv(unaff_R14,msg);
    if (iVar1 != 0) goto LAB_00134c06;
    if ((((nn_ep_options *)(ppvVar2 + 0xb))->sndprio == 5) ||
       ((*(byte *)((long)ppvVar2 + 0x5c) & 2) == 0)) goto LAB_00134bdf;
  }
  nn_sinproc_recv_cold_2();
LAB_00134bdf:
  iVar1 = nn_msgqueue_empty(unaff_R14);
  if (iVar1 == 0) {
    nn_pipebase_received((nn_pipebase *)(ppvVar2 + 0xd));
  }
  return 0;
}

Assistant:

static int nn_sinproc_recv (struct nn_pipebase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_sinproc *sinproc;

    sinproc = nn_cont (self, struct nn_sinproc, pipebase);

    /*  Sanity check. */
    nn_assert (sinproc->state == NN_SINPROC_STATE_ACTIVE ||
        sinproc->state == NN_SINPROC_STATE_DISCONNECTED);

    /*  Move the message to the caller. */
    rc = nn_msgqueue_recv (&sinproc->msgqueue, msg);
    errnum_assert (rc == 0, -rc);

    /*  If there was a message from peer lingering because of the exceeded
        buffer limit, try to enqueue it once again. */
    if (sinproc->state != NN_SINPROC_STATE_DISCONNECTED) {
        if (nn_slow (sinproc->flags & NN_SINPROC_FLAG_RECEIVING)) {
            rc = nn_msgqueue_send (&sinproc->msgqueue, &sinproc->peer->msg);
            nn_assert (rc == 0 || rc == -EAGAIN);
            if (rc == 0) {
                errnum_assert (rc == 0, -rc);
                nn_msg_init (&sinproc->peer->msg, 0);
                nn_fsm_raiseto (&sinproc->fsm, &sinproc->peer->fsm,
                    &sinproc->peer->event_received, NN_SINPROC_SRC_PEER,
                    NN_SINPROC_RECEIVED, sinproc);
                sinproc->flags &= ~NN_SINPROC_FLAG_RECEIVING;
            }
        }
    }

    if (!nn_msgqueue_empty (&sinproc->msgqueue))
       nn_pipebase_received (&sinproc->pipebase);

    return 0;
}